

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoundedRectangleProfileDef,_1UL>::
         Construct(DB *db,LIST *params)

{
  IfcRectangleProfileDef *this;
  
  this = (IfcRectangleProfileDef *)operator_new(0xc0);
  this[1].super_IfcParameterizedProfileDef.super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__Object_008048a0;
  this[1].super_IfcParameterizedProfileDef.super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(char **)&this[1].super_IfcParameterizedProfileDef.super_IfcProfileDef.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.field_0x10 =
       "IfcRoundedRectangleProfileDef";
  Assimp::IFC::Schema_2x3::IfcRectangleProfileDef::IfcRectangleProfileDef
            (this,&PTR_construction_vtable_24__0084c560);
  *(undefined8 *)&this->field_0x98 = 0;
  (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcRoundedRectangleProfileDef_0084c4a8;
  this[1].super_IfcParameterizedProfileDef.super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcRoundedRectangleProfileDef_0084c548;
  *(undefined ***)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.field_0x58 =
       &PTR__IfcRoundedRectangleProfileDef_0084c4d0;
  *(undefined ***)&(this->super_IfcParameterizedProfileDef).field_0x70 =
       &PTR__IfcRoundedRectangleProfileDef_0084c4f8;
  *(undefined ***)&this->field_0x90 = &PTR__IfcRoundedRectangleProfileDef_0084c520;
  GenericFill<Assimp::IFC::Schema_2x3::IfcRectangleProfileDef>(db,params,this);
  return (Object *)
         ((long)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper
         + (long)(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper
                 [-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }